

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::LimitTest::prepareVertexArray
          (LimitTest *this,_iteration iteration,_attributeType attribute_type,GLuint program_id,
          bool use_arrays)

{
  GLenum GVar1;
  int local_60;
  GLuint local_5c;
  GLint n_type;
  GLint i;
  attributeConfiguration configuration;
  GLuint vertex_attrib_divisor;
  GLint max_vertex_attribs;
  bool use_arrays_local;
  GLuint program_id_local;
  _attributeType attribute_type_local;
  _iteration iteration_local;
  LimitTest *this_local;
  
  configuration._44_4_ = Base::GetMaxVertexAttribs(&this->super_Base);
  configuration.m_vertex_length = (GLint)(attribute_type == PER_INSTANCE);
  attributeConfiguration::attributeConfiguration((attributeConfiguration *)&n_type);
  getVertexArrayConfiguration(this,iteration,(attributeConfiguration *)&n_type);
  for (local_5c = 0; (int)local_5c < (int)configuration._44_4_; local_5c = local_5c + 1) {
    (*(this->super_Base).gl.vertexAttribDivisor)(local_5c,configuration.m_vertex_length);
    GVar1 = (*(this->super_Base).gl.getError)();
    glu::checkError(GVar1,"VertexAttribDivisor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x917);
    (*(this->super_Base).gl.disableVertexAttribArray)(local_5c);
    GVar1 = (*(this->super_Base).gl.getError)();
    glu::checkError(GVar1,"DisableVertexAttribArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x91a);
  }
  for (local_60 = 0; local_60 < (int)configuration.m_n_rows; local_60 = local_60 + 1) {
    configureAttribute(this,iteration,(attributeConfiguration *)&n_type,local_60,program_id,
                       use_arrays,attribute_type != CONSTANT);
  }
  return;
}

Assistant:

void LimitTest::prepareVertexArray(_iteration iteration, _attributeType attribute_type, GLuint program_id,
								   bool use_arrays) const
{
	const GLint  max_vertex_attribs	= GetMaxVertexAttribs();
	const GLuint vertex_attrib_divisor = (PER_INSTANCE == attribute_type) ? 1 : 0;

	attributeConfiguration configuration;

	getVertexArrayConfiguration(iteration, configuration);

	/* Set vertex attributes divisor and disable */
	for (GLint i = 0; i < max_vertex_attribs; ++i)
	{
		gl.vertexAttribDivisor(i, vertex_attrib_divisor);
		GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribDivisor");

		gl.disableVertexAttribArray(i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DisableVertexAttribArray");
	}

	for (GLint n_type = 0; n_type < configuration.m_n_types; ++n_type)
	{
		configureAttribute(iteration, configuration, n_type, program_id, use_arrays, (CONSTANT != attribute_type));
	}
}